

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O0

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,5,15,2u>
          (Float<unsigned_int,_5,_5,_15,_2U> *other)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  StorageType SVar4;
  Float<unsigned_int,_5,_5,_15,_2U> *extraout_RAX;
  size_t *in_RCX;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *in_RSI;
  Float<unsigned_int,_5,_5,_15,_2U> *__tagb;
  uchar *in_R8;
  size_t in_R9;
  int bitDiff_1;
  deUint64 bias;
  deUint64 half;
  ulong uStack_38;
  int bitDiff;
  deUint64 m;
  int e;
  StorageType_conflict1 s;
  int eMax;
  int eMin;
  Float<unsigned_int,_5,_5,_15,_2U> *other_local;
  
  bVar2 = Float<unsigned_int,_5,_5,_15,_2U>::isInf(other);
  if (bVar2) {
    iVar3 = Float<unsigned_int,_5,_5,_15,_2U>::sign(other,in_RSI,sig,in_RCX,in_R8,in_R9);
    other_local = (Float<unsigned_int,_5,_5,_15,_2U> *)
                  Float<unsigned_long,_11,_52,_1023,_3U>::inf(iVar3);
  }
  else {
    __tagb = other;
    bVar2 = Float<unsigned_int,_5,_5,_15,_2U>::isNaN(other);
    if (bVar2) {
      Float<unsigned_long,_11,_52,_1023,_3U>::nan((char *)__tagb);
      other_local = extraout_RAX;
    }
    else {
      bVar2 = Float<unsigned_int,_5,_5,_15,_2U>::isZero(other);
      if (bVar2) {
        iVar3 = Float<unsigned_int,_5,_5,_15,_2U>::sign(other,in_RSI,sig_00,in_RCX,in_R8,in_R9);
        other_local = (Float<unsigned_int,_5,_5,_15,_2U> *)
                      Float<unsigned_long,_11,_52,_1023,_3U>::zero(iVar3);
      }
      else {
        iVar3 = Float<unsigned_int,_5,_5,_15,_2U>::signBit(other);
        m._4_4_ = Float<unsigned_int,_5,_5,_15,_2U>::exponent(other);
        SVar4 = Float<unsigned_int,_5,_5,_15,_2U>::mantissa(other);
        for (uStack_38 = (ulong)SVar4; (uStack_38 & 0x20) == 0; uStack_38 = uStack_38 << 1) {
          m._4_4_ = m._4_4_ + -1;
        }
        if (m._4_4_ < -0x3fe) {
          if (-0x3ff - m._4_4_ < 0x35) {
            bVar1 = -(char)m._4_4_ - 0x2d;
            Float<unsigned_long,_11,_52,_1023,_3U>::Float
                      ((Float<unsigned_long,_11,_52,_1023,_3U> *)&other_local,
                       (long)iVar3 << 0x3f |
                       uStack_38 + (1L << (-(char)m._4_4_ - 0x2eU & 0x3f)) + -1 +
                       (uStack_38 >> (bVar1 & 0x3f) & 1) >> (bVar1 & 0x3f));
          }
          else {
            iVar3 = Float<unsigned_int,_5,_5,_15,_2U>::sign(other,in_RSI,sig_01,in_RCX,in_R8,in_R9);
            other_local = (Float<unsigned_int,_5,_5,_15,_2U> *)
                          Float<unsigned_long,_11,_52,_1023,_3U>::zero(iVar3);
          }
        }
        else if (m._4_4_ < 0x400) {
          Float<unsigned_long,_11,_52,_1023,_3U>::Float
                    ((Float<unsigned_long,_11,_52,_1023,_3U> *)&other_local,
                     (long)iVar3 << 0x3f | (long)(m._4_4_ + 0x3ff) << 0x34 |
                     (uStack_38 & 0xffffffffffffffdf) << 0x2f);
        }
        else {
          iVar3 = Float<unsigned_int,_5,_5,_15,_2U>::sign
                            (other,in_RSI,sig_01,(size_t *)0x2f,in_R8,in_R9);
          other_local = (Float<unsigned_int,_5,_5,_15,_2U> *)
                        Float<unsigned_long,_11,_52,_1023,_3U>::inf(iVar3);
        }
      }
    }
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)(StorageType_conflict1)other_local;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}